

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_(CompilerMSL *this,Parameter *arg)

{
  BuiltIn id;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  ulong uVar6;
  char *pcVar7;
  size_type sVar8;
  SPIRVariable *in_RDX;
  BuiltIn builtin_00;
  bool local_77c;
  byte local_77b;
  bool local_77a;
  bool local_779;
  SPIRType *local_778;
  undefined1 local_758 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8 [32];
  spirv_cross local_6d8 [32];
  char *local_6b8;
  char *cv_flags;
  Bitset *local_6a8;
  Bitset *flags;
  SPIRVariable *local_698;
  SPIRVariable *backing_var;
  spirv_cross local_670 [32];
  undefined1 local_650 [64];
  char *local_610;
  char *img_address_space;
  undefined1 local_5e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [32];
  undefined1 local_548 [64];
  spirv_cross local_508 [36];
  uint32_t local_4e4;
  undefined1 local_4e0 [40];
  char *restrict_kw_1;
  string array_size_decl;
  undefined1 local_498 [64];
  spirv_cross local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [44];
  uint32_t array_size;
  char *argument_buffer_space;
  undefined1 local_3c8 [64];
  string local_388 [32];
  undefined1 local_368 [40];
  char *restrict_kw;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  spirv_cross local_2d8 [32];
  spirv_cross local_2b8 [32];
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  spirv_cross local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  spirv_cross local_218 [32];
  spirv_cross local_1f8 [32];
  spirv_cross local_1d8 [32];
  spirv_cross local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [8];
  string type_name;
  SPIRType *parent_type;
  spirv_cross local_150 [32];
  undefined1 local_130 [68];
  StorageClass local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [4];
  StorageClass storage;
  spirv_cross local_c8 [32];
  uint32_t local_a8;
  BuiltIn local_a4;
  float local_a0;
  BuiltIn builtin_type;
  undefined1 local_98 [7];
  bool builtin;
  string address_space;
  key_type local_75 [19];
  bool local_62;
  byte local_61;
  bool is_dynamic_img_sampler;
  __node_base_ptr p_Stack_60;
  char *cv_qualifier;
  bool type_is_tlas;
  bool type_is_image;
  bool constref;
  SPIRType *pSStack_50;
  uint32_t name_id;
  SPIRType *type;
  SPIRType *pSStack_40;
  bool passed_by_value;
  SPIRType *data_type;
  __node_base _Stack_30;
  StorageClass type_storage;
  SPIRType *var_type;
  SPIRVariable *var;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *decl;
  
  var = in_RDX;
  arg_local = arg;
  this_local = this;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(in_RDX->super_IVariant)._vptr_IVariant + 4));
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)arg,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
  _Stack_30._M_nxt = (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
  data_type._4_4_ = ((SPIRType *)_Stack_30._M_nxt)->storage;
  pSStack_40 = Compiler::get_variable_data_type((Compiler *)arg,(SPIRVariable *)var_type);
  type._7_1_ = Compiler::is_physical_pointer((Compiler *)arg,(SPIRType *)_Stack_30._M_nxt);
  if ((bool)type._7_1_) {
    local_778 = (SPIRType *)_Stack_30._M_nxt;
  }
  else {
    local_778 = pSStack_40;
  }
  pSStack_50 = local_778;
  cv_qualifier._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_type->super_IVariant).self);
  if (((var->storage & StorageClassInput) != StorageClassUniformConstant) &&
     (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns), uVar2 != 0)) {
    cv_qualifier._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns);
  }
  local_779 = false;
  if (((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
     (local_779 = false, (type._7_1_ & 1) == 0)) {
    bVar1 = Compiler::is_pointer((Compiler *)arg,(SPIRType *)_Stack_30._M_nxt);
    local_779 = false;
    if (bVar1) {
      local_779 = *(int *)&(var->super_IVariant).field_0xc == 0;
    }
  }
  cv_qualifier._3_1_ = local_779;
  bVar1 = type_is_msl_framebuffer_fetch((CompilerMSL *)arg,pSStack_50);
  if (bVar1) {
    cv_qualifier._3_1_ = 0;
  }
  else if (data_type._4_4_ == StorageClassUniformConstant) {
    cv_qualifier._3_1_ = 1;
  }
  local_77a = true;
  if ((pSStack_50->basetype != Image) && (local_77a = true, pSStack_50->basetype != SampledImage)) {
    local_77a = pSStack_50->basetype == Sampler;
  }
  cv_qualifier._2_1_ = local_77a;
  cv_qualifier._1_1_ = pSStack_50->basetype == AccelerationStructure;
  local_77b = 0;
  if ((cv_qualifier._3_1_ & 1) != 0) {
    local_77b = local_77a ^ 0xff;
  }
  p_Stack_60 = (__node_base_ptr)0x400321;
  if ((local_77b & 1) != 0) {
    p_Stack_60 = (__node_base_ptr)0x41738f;
  }
  local_61 = '\0';
  ::std::__cxx11::string::string((string *)this);
  local_77c = false;
  if ((((var->storage & StorageClassInput) == StorageClassUniformConstant) &&
      (local_77c = false, pSStack_50->basetype == SampledImage)) &&
     (local_77c = false, (pSStack_50->image).dim == Dim2D)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_50->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    bVar1 = type_is_floating_point(pSVar4);
    local_77c = false;
    if (bVar1) {
      local_75[0] = SPVFuncImplDynamicImageSampler;
      sVar5 = ::std::
              set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
              ::count((set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
                       *)&arg[0x1fe].read_count,local_75);
      local_77c = sVar5 != 0;
    }
  }
  local_62 = local_77c;
  get_argument_address_space_abi_cxx11_((CompilerMSL *)local_98,(SPIRVariable *)arg);
  local_a0 = (float)(var_type->super_IVariant).self.id;
  builtin_type._3_1_ = Compiler::has_decoration((Compiler *)arg,(ID)local_a0,DecorationBuiltIn);
  local_a8 = *(uint32_t *)((long)&(var->super_IVariant)._vptr_IVariant + 4);
  local_a4 = Compiler::get_decoration((Compiler *)arg,(ID)local_a8,DecorationBuiltIn);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns);
  builtin_00 = (BuiltIn)arg;
  if (uVar2 == 0) {
LAB_002e3fcd:
    if (((builtin_type._3_1_ & 1) == BuiltInPosition >> 0x18) ||
       (bVar1 = is_mesh_shader((CompilerMSL *)arg), bVar1)) {
      bVar1 = is_var_runtime_size_array((CompilerMSL *)arg,(SPIRVariable *)var_type);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_50->parent_type);
        pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(local_198,arg,pSVar4,uVar2);
        if (pSStack_50->basetype == AccelerationStructure) {
          join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2]>
                    (local_1b8,(char (*) [20])"spvDescriptorArray<",local_198,(char (*) [2])0x4222ea
                    );
          ::std::__cxx11::string::operator=((string *)this,(string *)local_1b8);
          ::std::__cxx11::string::~string((string *)local_1b8);
        }
        else if ((cv_qualifier._2_1_ & 1) == 0) {
          join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3]>
                    (local_1f8,(char (*) [20])"spvDescriptorArray<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [2])0x40c6cb,local_198,(char (*) [3])0x4222e9);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_1f8);
          ::std::__cxx11::string::~string((string *)local_1f8);
        }
        else {
          join<char_const(&)[20],char_const*&,std::__cxx11::string&,char_const(&)[2]>
                    (local_1d8,(char (*) [20])"spvDescriptorArray<",
                     (char **)&stack0xffffffffffffffa0,local_198,(char (*) [2])0x4222ea);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_1d8);
          ::std::__cxx11::string::~string((string *)local_1d8);
        }
        ::std::__cxx11::string::operator=((string *)local_98,"const");
        ::std::__cxx11::string::~string((string *)local_198);
      }
      else if (((data_type._4_4_ == StorageClassUniform) ||
               (data_type._4_4_ == StorageClassStorageBuffer)) &&
              (bVar1 = Compiler::is_array((Compiler *)arg,pSStack_50), pSVar4 = pSStack_50, bVar1))
      {
        *(undefined1 *)((long)&arg[0x233].write_count + 2) = 1;
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(local_238,arg,pSVar4,uVar2);
        join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                  (local_218,(char **)&stack0xffffffffffffffa0,local_238,(char (*) [2])0x4127db);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_218);
        ::std::__cxx11::string::~string((string *)local_218);
        ::std::__cxx11::string::~string((string *)local_238);
      }
      else if ((local_62 & 1U) == 0) {
        bVar1 = Compiler::is_pointer((Compiler *)arg,pSStack_40);
        pSVar4 = pSStack_50;
        if (bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          (**(code **)(*(long *)arg + 0x98))(local_298,arg,pSVar4,uVar2);
          ::std::__cxx11::string::operator=((string *)this,local_298);
          ::std::__cxx11::string::~string(local_298);
          if (*(char *)&p_Stack_60->_M_nxt != '\0') {
            join<char_const(&)[2],char_const*&>
                      (local_2b8,(char (*) [2])0x40c6cb,(char **)&stack0xffffffffffffffa0);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_2b8);
            ::std::__cxx11::string::~string((string *)local_2b8);
          }
        }
        else {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
          (**(code **)(*(long *)arg + 0x98))(local_2f8,arg,pSVar4,uVar2);
          join<char_const*&,std::__cxx11::string>
                    (local_2d8,(char **)&stack0xffffffffffffffa0,local_2f8);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_2d8);
          ::std::__cxx11::string::~string((string *)local_2d8);
          ::std::__cxx11::string::~string((string *)local_2f8);
        }
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_50->image);
        pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
        (**(code **)(*(long *)arg + 0x98))(local_278,arg,pSVar4,0);
        join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (local_258,(char **)&stack0xffffffffffffffa0,
                   (char (*) [24])"spvDynamicImageSampler<",local_278,(char (*) [2])0x4222ea);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_258);
        ::std::__cxx11::string::~string((string *)local_258);
        ::std::__cxx11::string::~string((string *)local_278);
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        Compiler::set_extended_decoration
                  ((Compiler *)arg,uVar2,SPIRVCrossDecorationDynamicImageSampler,0);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(var_type->super_IVariant).field_0xc);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
      local_ec = pSVar4->storage;
      if ((local_ec == StorageClassInput) &&
         ((local_a4 == BuiltInTessLevelInner || (local_a4 == BuiltInTessLevelOuter)))) {
        *(undefined1 *)((long)&arg[0x233].write_count + 2) = 0;
      }
      else if ((local_a4 != BuiltInClipDistance) && (local_a4 != BuiltInCullDistance)) {
        *(undefined1 *)((long)&arg[0x233].write_count + 2) = 1;
      }
      if (((local_ec == StorageClassOutput) &&
          (bVar1 = variable_storage_requires_stage_io((CompilerMSL *)arg,StorageClassOutput), bVar1)
          ) && (bVar1 = CompilerGLSL::is_stage_output_builtin_masked((CompilerGLSL *)arg,local_a4),
               !bVar1)) {
        *(undefined1 *)((long)&arg[0x233].write_count + 2) = 1;
      }
      pSVar4 = pSStack_50;
      id = local_a4;
      if ((arg[0x233].write_count & 0x10000) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        (**(code **)(*(long *)arg + 0x98))(&parent_type,arg,pSVar4,uVar2);
        join<char_const*&,std::__cxx11::string>
                  (local_150,(char **)&stack0xffffffffffffffa0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent_type
                  );
        ::std::__cxx11::string::operator=((string *)this,(string *)local_150);
        ::std::__cxx11::string::~string((string *)local_150);
        ::std::__cxx11::string::~string((string *)&parent_type);
      }
      else {
        TypedID::operator_cast_to_unsigned_int
                  ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
        builtin_type_decl_abi_cxx11_((CompilerMSL *)local_130,builtin_00,id);
        join<char_const*&,std::__cxx11::string>
                  ((spirv_cross *)(local_130 + 0x20),(char **)&stack0xffffffffffffffa0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
        ::std::__cxx11::string::operator=((string *)this,(string *)(local_130 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_130 + 0x20));
        ::std::__cxx11::string::~string((string *)local_130);
      }
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg[0x231].alias_global_variable);
    if (uVar2 != uVar3) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(arg + 0x232));
      if (uVar2 != uVar3) goto LAB_002e3fcd;
    }
    pSVar4 = pSStack_50;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&(var->super_IVariant)._vptr_IVariant + 4));
    (**(code **)(*(long *)arg + 0x98))(local_e8,arg,pSVar4,uVar2);
    join<char_const*&,std::__cxx11::string>(local_c8,(char **)&stack0xffffffffffffffa0,local_e8);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
    ::std::__cxx11::string::~string((string *)local_e8);
  }
  if (((type._7_1_ & 1) == 0) &&
     ((((builtin_type._3_1_ & 1) != BuiltInPosition >> 0x18 ||
       (bVar1 = Compiler::is_pointer((Compiler *)arg,(SPIRType *)_Stack_30._M_nxt), bVar1)) ||
      ((data_type._4_4_ != StorageClassFunction && (data_type._4_4_ != StorageClassGeneric)))))) {
    bVar1 = Compiler::is_array((Compiler *)arg,pSStack_50);
    if ((bVar1) && ((cv_qualifier._2_1_ & 1) == 0)) {
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  ((spirv_cross *)&argument_buffer_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   (char (*) [2])0x40c6cb,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        ::std::__cxx11::string::operator=((string *)this,(string *)&argument_buffer_space);
        ::std::__cxx11::string::~string((string *)&argument_buffer_space);
      }
      bVar1 = is_var_runtime_size_array((CompilerMSL *)arg,(SPIRVariable *)var_type);
      if ((!bVar1) &&
         (register0x00000000 =
               (Variant *)
               descriptor_address_space
                         ((CompilerMSL *)arg,cv_qualifier._4_4_,data_type._4_4_,(char *)0x0),
         register0x00000000 != (Variant *)0x0)) {
        ::std::__cxx11::string::operator+=((string *)this," ");
        ::std::__cxx11::string::operator+=((string *)this,(char *)stack0xfffffffffffffc10);
      }
      bVar1 = is_tesc_shader((CompilerMSL *)arg);
      if (((bVar1) && ((builtin_type._3_1_ & 1) != BuiltInPosition >> 0x18)) &&
         ((local_a4 == BuiltInTessLevelInner || (local_a4 == BuiltInTessLevelOuter)))) {
        local_418._36_4_ = get_physical_tess_level_array_size((CompilerMSL *)arg,local_a4);
        if (local_418._36_4_ == 1) {
          ::std::__cxx11::string::operator+=((string *)this," &");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_418,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_418);
          ::std::__cxx11::string::~string((string *)local_418);
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this," (&");
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_438,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_438);
          ::std::__cxx11::string::~string((string *)local_438);
          ::std::__cxx11::string::operator+=((string *)this,")");
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (local_458,(char (*) [2])0x40f992,(uint *)(local_418 + 0x24),
                     (char (*) [2])0x40f897);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_458);
          ::std::__cxx11::string::~string((string *)local_458);
        }
      }
      else {
        bVar1 = is_var_runtime_size_array((CompilerMSL *)arg,(SPIRVariable *)var_type);
        if (bVar1) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_498,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::operator+(local_498 + 0x20,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x40c6cb);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_498 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_498 + 0x20));
          ::std::__cxx11::string::~string((string *)local_498);
        }
        else {
          (**(code **)(*(long *)arg + 0x138))(&restrict_kw_1,arg,pSStack_50,cv_qualifier._4_4_);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)this," (&");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)this,"& ");
          }
          local_4e0._32_8_ = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
          if ((char)*(uint *)local_4e0._32_8_ != '\0') {
            ::std::__cxx11::string::operator+=((string *)this," ");
            ::std::__cxx11::string::operator+=((string *)this,(char *)local_4e0._32_8_);
          }
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_4e0,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_4e0);
          ::std::__cxx11::string::~string((string *)local_4e0);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)this,")");
            ::std::__cxx11::string::operator+=((string *)this,(string *)&restrict_kw_1);
          }
          ::std::__cxx11::string::~string((string *)&restrict_kw_1);
        }
      }
    }
    else {
      bVar1 = false;
      if (((cv_qualifier._2_1_ & 1) == 0) && (bVar1 = false, (cv_qualifier._1_1_ & 1) == 0)) {
        local_4e4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type->columns);
        sVar8 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&arg[0x260].read_count,&local_4e4);
        bVar1 = true;
        if (sVar8 != 0) {
          bVar1 = pSStack_50->basetype == Struct;
        }
      }
      if (bVar1) {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar1 = Compiler::is_pointer((Compiler *)arg,pSStack_40);
          if (bVar1) {
            if (*(char *)&p_Stack_60->_M_nxt == '\0') {
              ::std::__cxx11::string::operator+=((string *)this,' ');
            }
            join<std::__cxx11::string&,char_const(&)[2]>
                      (local_508,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(char (*) [2])0x40c6cb);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_508);
            ::std::__cxx11::string::~string((string *)local_508);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      ((spirv_cross *)(local_548 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
            ::std::__cxx11::string::operator=((string *)this,(string *)(local_548 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_548 + 0x20));
          }
        }
        ::std::__cxx11::string::operator+=((string *)this,"&");
        ::std::__cxx11::string::operator+=((string *)this," ");
        pcVar7 = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
        ::std::__cxx11::string::operator+=((string *)this,pcVar7);
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_548,builtin_00,SUB41(cv_qualifier._4_4_,0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_548);
        ::std::__cxx11::string::~string((string *)local_548);
      }
      else if (((cv_qualifier._2_1_ & 1) == 0) && ((cv_qualifier._1_1_ & 1) == 0)) {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [2])0x40c6cb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_670);
          ::std::__cxx11::string::~string((string *)local_670);
        }
        ::std::__cxx11::string::operator+=((string *)this," ");
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)&backing_var,builtin_00,SUB41(cv_qualifier._4_4_,0));
        ::std::__cxx11::string::operator+=((string *)this,(string *)&backing_var);
        ::std::__cxx11::string::~string((string *)&backing_var);
      }
      else {
        bVar1 = is_var_runtime_size_array((CompilerMSL *)arg,(SPIRVariable *)var_type);
        if (bVar1) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_5e8 + 0x20),local_98);
          ::std::operator+(local_5a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_5e8 + 0x20));
          ::std::operator+(local_588,(char *)local_5a8);
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_5e8,builtin_00,SUB41(cv_qualifier._4_4_,0));
          ::std::operator+(local_568,local_588);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_568);
          ::std::__cxx11::string::~string((string *)local_568);
          ::std::__cxx11::string::~string((string *)local_5e8);
          ::std::__cxx11::string::~string((string *)local_588);
          ::std::__cxx11::string::~string((string *)local_5a8);
          ::std::__cxx11::string::~string((string *)(local_5e8 + 0x20));
        }
        else {
          bVar1 = VectorView<unsigned_int>::empty
                            (&(pSStack_50->array).super_VectorView<unsigned_int>);
          if (bVar1) {
            ::std::__cxx11::string::operator+=((string *)this," ");
            CompilerGLSL::to_expression_abi_cxx11_
                      ((CompilerGLSL *)&img_address_space,builtin_00,SUB41(cv_qualifier._4_4_,0));
            ::std::__cxx11::string::operator+=((string *)this,(string *)&img_address_space);
            ::std::__cxx11::string::~string((string *)&img_address_space);
          }
          else {
            local_610 = descriptor_address_space
                                  ((CompilerMSL *)arg,cv_qualifier._4_4_,data_type._4_4_,
                                   "thread const");
            join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                      ((spirv_cross *)(local_650 + 0x20),&local_610,(char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
            ::std::__cxx11::string::operator=((string *)this,(string *)(local_650 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_650 + 0x20));
            ::std::__cxx11::string::operator+=((string *)this,"& ");
            CompilerGLSL::to_expression_abi_cxx11_
                      ((CompilerGLSL *)local_650,builtin_00,SUB41(cv_qualifier._4_4_,0));
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_650);
            ::std::__cxx11::string::~string((string *)local_650);
          }
        }
      }
    }
  }
  else if (((arg[0x1fc].field_0x13 & 1) == 0) ||
          (bVar1 = Compiler::is_array((Compiler *)arg,pSStack_50), !bVar1)) {
    uVar6 = ::std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                ((spirv_cross *)(local_3c8 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      ::std::__cxx11::string::operator=((string *)this,(string *)(local_3c8 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
    }
    ::std::__cxx11::string::operator+=((string *)this," ");
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_3c8,builtin_00,SUB41(cv_qualifier._4_4_,0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c8);
    ::std::__cxx11::string::~string((string *)local_3c8);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_338,"thread const ",(allocator *)((long)&restrict_kw + 7));
    ::std::operator+(local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
    ;
    ::std::__cxx11::string::operator=((string *)this,(string *)local_318);
    ::std::__cxx11::string::~string((string *)local_318);
    ::std::__cxx11::string::~string(local_338);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&restrict_kw + 7));
    ::std::__cxx11::string::operator+=((string *)this," (&");
    local_368._32_8_ = to_restrict((CompilerMSL *)arg,cv_qualifier._4_4_,true);
    if ((char)((TypedID<(spirv_cross::Types)0> *)local_368._32_8_)->id != '\0') {
      ::std::__cxx11::string::operator+=((string *)this," ");
      ::std::__cxx11::string::operator+=((string *)this,(char *)local_368._32_8_);
    }
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_368,builtin_00,SUB41(cv_qualifier._4_4_,0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_368);
    ::std::__cxx11::string::~string((string *)local_368);
    ::std::__cxx11::string::operator+=((string *)this,")");
    (**(code **)(*(long *)arg + 0x138))(local_388,arg,pSStack_50,cv_qualifier._4_4_);
    ::std::__cxx11::string::operator+=((string *)this,local_388);
    ::std::__cxx11::string::~string(local_388);
  }
  local_698 = Compiler::maybe_get_backing_variable((Compiler *)arg,cv_qualifier._4_4_);
  bVar1 = false;
  if (local_698 != (SPIRVariable *)0x0) {
    flags._4_4_ = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_698->super_IVariant).self);
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&arg[0x25d].write_count,(key_type *)((long)&flags + 4));
    bVar1 = sVar8 != 0;
  }
  if (bVar1) {
    cv_flags._4_4_ = (local_698->super_IVariant).self.id;
    local_6a8 = ParsedIR::get_decoration_bitset((ParsedIR *)&arg->read_count,cv_flags._4_4_);
    bVar1 = decoration_flags_signal_volatile(local_6a8);
    local_6b8 = "";
    if (bVar1) {
      local_6b8 = "volatile ";
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(_Stack_30._M_nxt + 0x21));
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar2);
    (**(code **)(*(long *)arg + 0x98))(local_6f8,arg,pSVar4,0);
    join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
              (local_6d8,(char (*) [3])0x421228,&local_6b8,(char (*) [15])"device atomic_",local_6f8
              );
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_6d8);
    ::std::__cxx11::string::~string((string *)local_6d8);
    ::std::__cxx11::string::~string((string *)local_6f8);
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_758,builtin_00,SUB41(cv_qualifier._4_4_,0));
    ::std::operator+(local_758 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4245d4);
    ::std::operator+(local_718,local_758 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_718);
    ::std::__cxx11::string::~string((string *)local_718);
    ::std::__cxx11::string::~string((string *)(local_758 + 0x20));
    ::std::__cxx11::string::~string((string *)local_758);
  }
  *(undefined1 *)((long)&arg[0x233].write_count + 2) = 0;
  local_61 = 1;
  ::std::__cxx11::string::~string((string *)local_98);
  if ((local_61 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;

	// Physical pointer types are passed by pointer, not reference.
	auto &data_type = get_variable_data_type(var);
	bool passed_by_value = is_physical_pointer(var_type);
	auto &type = passed_by_value ? var_type : data_type;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && !passed_by_value && is_pointer(var_type) && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;
	bool type_is_tlas = type.basetype == SPIRType::AccelerationStructure;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin && !is_mesh_shader())
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if (is_var_runtime_size_array(var))
	{
		const auto *parent_type = &get<SPIRType>(type.parent_type);
		auto type_name = type_to_glsl(*parent_type, arg.id);
		if (type.basetype == SPIRType::AccelerationStructure)
			decl = join("spvDescriptorArray<", type_name, ">");
		else if (type_is_image)
			decl = join("spvDescriptorArray<", cv_qualifier, type_name, ">");
		else
			decl = join("spvDescriptorArray<", address_space, " ", type_name, "*>");
		address_space = "const";
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (is_pointer(data_type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
		{
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
		}
	}

	if (passed_by_value || (!builtin && !is_pointer(var_type) &&
	                        (type_storage == StorageClassFunction || type_storage == StorageClassGeneric)))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type, name_id);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		// spvDescriptorArray absorbs the address space inside the template.
		if (!is_var_runtime_size_array(var))
		{
			const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
			if (argument_buffer_space)
			{
				decl += " ";
				decl += argument_buffer_space;
			}
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else if (is_var_runtime_size_array(var))
		{
			decl += " " + to_expression(name_id);
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type, name_id);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && !type_is_tlas &&
	         (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (is_pointer(data_type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}

		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image || type_is_tlas)
	{
		if (is_var_runtime_size_array(var))
		{
			decl = address_space + " " + decl + " " + to_expression(name_id);
		}
		else if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		auto &flags = ir.get_decoration_bitset(backing_var->self);
		const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
		decl += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(var_type.image.type), 0));
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}